

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::EasyHandle::Close(EasyHandle *this)

{
  ostream *poVar1;
  
  if (this->handle_ != (handle_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Cleaning easy-handle ",0x15);
    poVar1 = std::ostream::_M_insert<void_const*>(&std::clog);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    curl_easy_cleanup(this->handle_);
    this->handle_ = (handle_t)0x0;
  }
  return;
}

Assistant:

void Close() {
            if (handle_) {
                RESTINCURL_LOG("Cleaning easy-handle " << handle_);
                curl_easy_cleanup(handle_);
                handle_ = nullptr;
            }
        }